

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

char * Ses_ManFindMinimumSizeTopDown(Ses_Man_t *pSes,int nMinGates)

{
  int iVar1;
  char *local_30;
  char *pSol2;
  char *pSol;
  int local_18;
  int fRes;
  int nGates;
  int nMinGates_local;
  Ses_Man_t *pSes_local;
  
  local_18 = pSes->nMaxGates;
  pSol2 = (char *)0x0;
  local_30 = (char *)0x0;
  pSes->fHitResLimit = 0;
  fRes = nMinGates;
  _nGates = pSes;
  Abc_DebugPrintIntInt(" (%d/%d)",local_18,pSes->nMaxGates,pSes->fVeryVerbose);
  while (pSol._4_4_ = Ses_ManFindNetworkExactCEGAR(_nGates,local_18,&local_30), pSol._4_4_ != 0) {
    if ((pSol._4_4_ == 2) || (pSol._4_4_ == 3)) goto LAB_00307530;
    pSol2 = local_30;
    if (local_18 == fRes) goto LAB_00307530;
    local_18 = local_18 + -1;
  }
  _nGates->fHitResLimit = 1;
LAB_00307530:
  iVar1 = 4;
  if (9 < local_18) {
    iVar1 = 5;
  }
  Abc_DebugErase(_nGates->nDebugOffset + iVar1,_nGates->fVeryVerbose);
  return pSol2;
}

Assistant:

static char * Ses_ManFindMinimumSizeTopDown( Ses_Man_t * pSes, int nMinGates )
{
    int nGates = pSes->nMaxGates, fRes;
    char * pSol = NULL, * pSol2 = NULL;

    pSes->fHitResLimit = 0;

    Abc_DebugPrintIntInt( " (%d/%d)", nGates, pSes->nMaxGates, pSes->fVeryVerbose );

    while ( true )
    {
        fRes = Ses_ManFindNetworkExactCEGAR( pSes, nGates, &pSol2 );

        if ( fRes == 0 )
        {
            pSes->fHitResLimit = 1;
            break;
        }
        else if ( fRes == 2 || fRes == 3 )
            break;

        pSol = pSol2;

        if ( nGates == nMinGates )
            break;

        --nGates;
    }

    Abc_DebugErase( pSes->nDebugOffset + ( nGates >= 10 ? 5 : 4 ), pSes->fVeryVerbose );

    return pSol;
}